

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O2

optional_idx duckdb::GetStorageVersion(char *version_string)

{
  long lVar1;
  int iVar2;
  idx_t in_RAX;
  long lVar3;
  optional_idx local_28;
  
  lVar1 = 0;
  local_28.index = in_RAX;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x350) {
      return (optional_idx)0xffffffffffffffff;
    }
    iVar2 = strcmp(*(char **)((long)&storage_version_info + lVar3),version_string);
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  optional_idx::optional_idx(&local_28,*(idx_t *)((long)&DAT_027c3828 + lVar3));
  return (optional_idx)local_28.index;
}

Assistant:

optional_idx GetStorageVersion(const char *version_string) {
	for (idx_t i = 0; storage_version_info[i].version_name; i++) {
		if (!strcmp(storage_version_info[i].version_name, version_string)) {
			return storage_version_info[i].storage_version;
		}
	}
	return optional_idx();
}